

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDComponentPtr::CompareComponent(ON_SubDComponentPtr *a,ON_SubDComponentPtr *b)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = CompareType(a,b);
  if ((a != b && uVar1 == 0) &&
     (uVar2 = a->m_ptr & 0xfffffffffffffff8, uVar3 = b->m_ptr & 0xfffffffffffffff8, uVar2 != uVar3))
  {
    uVar1 = -(uint)(uVar2 < uVar3) | 1;
  }
  return uVar1;
}

Assistant:

int ON_SubDComponentPtr::CompareComponent(
  const ON_SubDComponentPtr* a,
  const ON_SubDComponentPtr* b
)
{
  const int rc = ON_SubDComponentPtr::CompareType(a, b);
  if (0 == rc && a != b)
  {
    // 0 == ON_SubDComponentPtr::CompareType(a, b) and a != b insures both pointers are not nullptr.
    const ON__UINT_PTR x = (a->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
    const ON__UINT_PTR y = (b->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
    if (x < y)
      return -1;
    if (x > y)
      return 1;
  }
  return rc;
}